

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::
     Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>
                *alloc,void *p,size_t n)

{
  long in_RDX;
  A mem_alloc;
  M *p_00;
  uint3 in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  M local_19 [3];
  
  uVar1 = (uint)in_stack_ffffffffffffffd0;
  if (in_RDX != 0) {
    uVar1 = CONCAT13(1,in_stack_ffffffffffffffd0);
  }
  if ((char)(uVar1 >> 0x18) == '\0') {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                  ,0x1222,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const std::basic_string<char>, cs::csym_info>>]"
                 );
  }
  p_00 = local_19;
  std::
  allocator<phmap::priv::Deallocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>(std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>*,void*,unsigned_long)::M>
  ::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>
            ((allocator<M> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),
             (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>
              *)p_00);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),p_00,0x13ff92);
  std::allocator<M>::~allocator((allocator<M> *)0x13ff9e);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n)
		{
			static_assert(Alignment > 0, "");
			assert(n && "n must be positive");
			struct alignas(Alignment) M {};
			using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
			using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
			A mem_alloc(*alloc);
			AT::deallocate(mem_alloc, static_cast<M*>(p),
			               (n + sizeof(M) - 1) / sizeof(M));
		}